

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O0

void __thiscall wasm::Flatten::visitExpression(Flatten *this,Expression *curr)

{
  allocator<wasm::Expression_*> *this_00;
  MixedArena *pMVar1;
  bool bVar2;
  Index IVar3;
  int iVar4;
  Index index;
  Module *pMVar5;
  id *this_01;
  Expression **ppEVar6;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *this_02;
  pointer ppVar7;
  LocalSet *pLVar8;
  If *this_03;
  Loop *this_04;
  Try *this_05;
  ulong uVar9;
  size_t sVar10;
  reference ppEVar11;
  pointer ppVar12;
  Type type_00;
  Break *this_06;
  undefined4 extraout_var;
  reference pNVar13;
  Expression *pEVar14;
  Function *pFVar15;
  LocalGet *pLVar16;
  mapped_type *pmVar17;
  reference ppEVar18;
  Iterator IVar19;
  Iterator __last;
  Expression *local_448;
  Expression *local_440;
  Expression *prelude_2;
  iterator __end4_1;
  iterator __begin4_1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range4_1;
  mapped_type *parentPreludes;
  Expression *parent;
  LocalSet *local_408;
  uintptr_t local_400;
  Index local_3f4;
  Type TStack_3f0;
  Index temp_6;
  Type type_6;
  Visitor<wasm::ReFinalizeNode,_void> local_3dd;
  BasicType local_3dc;
  uintptr_t local_3d8;
  uintptr_t local_3d0;
  size_t local_3c8;
  char *pcStack_3c0;
  LocalSet *local_3b0;
  size_t sStack_3a8;
  Name name;
  _Self local_390;
  iterator __end8;
  iterator __begin8;
  NameSet *__range8;
  NameSet names;
  Type TStack_330;
  Index temp_5;
  Type type_5;
  Switch *sw;
  uintptr_t local_318;
  Break *local_310;
  LocalSet *local_308;
  uintptr_t local_300;
  LocalSet *local_2f8;
  uintptr_t local_2f0;
  size_t local_2e8;
  char *pcStack_2e0;
  Index local_2cc;
  size_t sStack_2c8;
  Index temp_4;
  char *pcStack_2c0;
  Type local_2b8;
  Type blockType;
  Type type_4;
  Break *br;
  Type localType;
  BasicType local_284;
  LocalSet *local_280;
  LocalSet *set;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
  local_270;
  iterator iter_2;
  Try *pTStack_260;
  Index i_1;
  uintptr_t local_258;
  uint local_24c;
  uintptr_t uStack_248;
  Index i;
  Index local_23c;
  Type TStack_238;
  Index temp_3;
  Type type_3;
  undefined1 local_208 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> originalCatchBodies;
  Expression *originalBody_1;
  Expression *rep_3;
  Try *tryy;
  Loop *local_1d0;
  uintptr_t local_1c8;
  uintptr_t local_1c0;
  Index local_1b4;
  Type TStack_1b0;
  Index temp_2;
  Type type_2;
  Expression *originalBody;
  Expression *rep_2;
  Loop *loop;
  Expression *local_188;
  Expression *local_180;
  Index local_174;
  Expression *pEStack_170;
  Index temp_1;
  Expression *prelude_1;
  Type type_1;
  Expression *originalIfFalse;
  Expression *originalIfTrue;
  Expression *rep_1;
  If *iff;
  MixedArena *local_138;
  uintptr_t local_130;
  LocalGet *local_128;
  LocalGet *rep;
  Expression **local_118;
  Expression **last;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_108;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_100;
  iterator iter_1;
  Type TStack_f0;
  Index temp;
  Type type;
  Expression *prelude;
  iterator __end6;
  iterator __begin6;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range6;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *itemPreludes;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
  local_b8;
  iterator iter;
  Expression *item;
  Iterator __end4;
  Iterator __begin4;
  ExpressionList *__range4;
  ExpressionList newList;
  Block *block;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
  local_50;
  undefined4 local_48;
  Builder local_38;
  Builder builder;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> ourPreludes;
  Expression *curr_local;
  Flatten *this_local;
  
  ourPreludes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)curr;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
  pMVar5 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::getModule
                     ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *
                      )&(this->
                        super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                        ).
                        super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                     );
  Builder::Builder(&local_38,pMVar5);
  bVar2 = Properties::isConstantExpression
                    ((Expression *)
                     ourPreludes.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((bVar2) ||
     (bVar2 = Expression::is<wasm::Nop>
                        ((Expression *)
                         ourPreludes.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar2)) {
    local_48 = 1;
  }
  else {
    bVar2 = Properties::isControlFlowStructure
                      ((Expression *)
                       ourPreludes.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar2) {
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
           ::find(&this->preludes,
                  (key_type *)
                  &ourPreludes.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
      block = (Block *)std::
                       unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                       ::end(&this->preludes);
      bVar2 = std::__detail::operator==
                        (&local_50,
                         (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                          *)&block);
      if (!bVar2) {
        __assert_fail("preludes.find(curr) == preludes.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                      ,0x68,"void wasm::Flatten::visitExpression(Expression *)");
      }
      newList.allocator =
           (MixedArena *)
           Expression::dynCast<wasm::Block>
                     ((Expression *)
                      ourPreludes.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((Block *)newList.allocator == (Block *)0x0) {
        this_03 = Expression::dynCast<wasm::If>
                            ((Expression *)
                             ourPreludes.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (this_03 == (If *)0x0) {
          this_04 = Expression::dynCast<wasm::Loop>
                              ((Expression *)
                               ourPreludes.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (this_04 == (Loop *)0x0) {
            this_05 = Expression::dynCast<wasm::Try>
                                ((Expression *)
                                 ourPreludes.
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (this_05 == (Try *)0x0) {
              handle_unreachable("unexpected expr type",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                                 ,0xe5);
            }
            originalCatchBodies.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)this_05->body;
            IVar19 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                               (&(this_05->catchBodies).
                                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               );
            __last = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                               (&(this_05->catchBodies).
                                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               );
            this_00 = (allocator<wasm::Expression_*> *)((long)&type_3.id + 7);
            std::allocator<wasm::Expression_*>::allocator(this_00);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            vector<ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::Iterator,void>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_208,
                       IVar19,__last,this_00);
            std::allocator<wasm::Expression_*>::~allocator
                      ((allocator<wasm::Expression_*> *)((long)&type_3.id + 7));
            TStack_238.id =
                 (this_05->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.type
                 .id;
            bVar2 = wasm::Type::isConcrete(&stack0xfffffffffffffdc8);
            originalBody_1 = (Expression *)this_05;
            if (bVar2) {
              pFVar15 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                        ::getFunction((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                       *)&(this->
                                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                          ).
                                          super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     );
              uStack_248 = TStack_238.id;
              local_23c = Builder::addVar(pFVar15,TStack_238);
              bVar2 = wasm::Type::isConcrete(&this_05->body->type);
              if (bVar2) {
                pLVar8 = Builder::makeLocalSet(&local_38,local_23c,this_05->body);
                this_05->body = (Expression *)pLVar8;
              }
              for (local_24c = 0; uVar9 = (ulong)local_24c,
                  sVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                           size(&(this_05->catchBodies).
                                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ), uVar9 < sVar10; local_24c = local_24c + 1) {
                ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                          operator[](&(this_05->catchBodies).
                                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                     ,(ulong)local_24c);
                bVar2 = wasm::Type::isConcrete(&(*ppEVar6)->type);
                IVar3 = local_23c;
                if (bVar2) {
                  ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                            operator[](&(this_05->catchBodies).
                                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                       ,(ulong)local_24c);
                  pLVar8 = Builder::makeLocalSet(&local_38,IVar3,*ppEVar6);
                  ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                            operator[](&(this_05->catchBodies).
                                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                       ,(ulong)local_24c);
                  *ppEVar6 = (Expression *)pLVar8;
                }
              }
              local_258 = TStack_238.id;
              originalBody_1 = (Expression *)Builder::makeLocalGet(&local_38,local_23c,TStack_238);
              pTStack_260 = this_05;
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder
                         ,(value_type *)&stack0xfffffffffffffda0);
            }
            pEVar14 = getPreludesWithExpression
                                (this,(Expression *)
                                      originalCatchBodies.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 this_05->body);
            this_05->body = pEVar14;
            for (iter_2.
                 super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                 ._M_cur._4_4_ = 0;
                uVar9 = (ulong)iter_2.
                               super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                               ._M_cur._4_4_,
                sVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                                   (&(this_05->catchBodies).
                                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   ), uVar9 < sVar10;
                iter_2.
                super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                ._M_cur._4_4_ =
                     iter_2.
                     super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                     ._M_cur._4_4_ + 1) {
              ppEVar11 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
                         operator[]((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     *)local_208,
                                    (ulong)iter_2.
                                           super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                                           ._M_cur._4_4_);
              pEVar14 = *ppEVar11;
              ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                        operator[](&(this_05->catchBodies).
                                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   ,(ulong)iter_2.
                                           super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                                           ._M_cur._4_4_);
              pEVar14 = getPreludesWithExpression(this,pEVar14,*ppEVar6);
              ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                        operator[](&(this_05->catchBodies).
                                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   ,(ulong)iter_2.
                                           super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                                           ._M_cur._4_4_);
              *ppEVar6 = pEVar14;
            }
            Try::finalize(this_05);
            ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
            ::replaceCurrent(&(this->
                              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                              ).
                              super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             ,originalBody_1);
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_208)
            ;
          }
          else {
            type_2.id = (uintptr_t)this_04->body;
            TStack_1b0.id =
                 (this_04->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.
                 id;
            bVar2 = wasm::Type::isConcrete(&stack0xfffffffffffffe50);
            originalBody = (Expression *)this_04;
            if (bVar2) {
              pFVar15 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                        ::getFunction((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                       *)&(this->
                                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                          ).
                                          super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     );
              local_1c0 = TStack_1b0.id;
              local_1b4 = Builder::addVar(pFVar15,TStack_1b0);
              pLVar8 = Builder::makeLocalSet(&local_38,local_1b4,this_04->body);
              this_04->body = (Expression *)pLVar8;
              local_1c8 = TStack_1b0.id;
              originalBody = (Expression *)Builder::makeLocalGet(&local_38,local_1b4,TStack_1b0);
              local_1d0 = this_04;
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder
                         ,(value_type *)&local_1d0);
              wasm::Type::Type((Type *)&tryy,none);
              (this_04->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id
                   = (uintptr_t)tryy;
            }
            pEVar14 = getPreludesWithExpression(this,(Expression *)type_2.id,this_04->body);
            this_04->body = pEVar14;
            Loop::finalize(this_04);
            ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
            ::replaceCurrent(&(this->
                              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                              ).
                              super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             ,originalBody);
          }
        }
        else {
          originalIfTrue = getPreludesWithExpression(this,this_03->condition,(Expression *)this_03);
          pEVar14 = this_03->ifTrue;
          type_1.id = (uintptr_t)this_03->ifFalse;
          prelude_1 = (Expression *)
                      (this_03->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.
                      type.id;
          pEStack_170 = (Expression *)0x0;
          bVar2 = wasm::Type::isConcrete((Type *)&prelude_1);
          if (bVar2) {
            pFVar15 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
                      getFunction((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   *)&(this->
                                      super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                      ).
                                      super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 );
            local_180 = prelude_1;
            local_174 = Builder::addVar(pFVar15,(Type)prelude_1);
            bVar2 = wasm::Type::isConcrete(&this_03->ifTrue->type);
            if (bVar2) {
              pLVar8 = Builder::makeLocalSet(&local_38,local_174,this_03->ifTrue);
              this_03->ifTrue = (Expression *)pLVar8;
            }
            if ((this_03->ifFalse != (Expression *)0x0) &&
               (bVar2 = wasm::Type::isConcrete(&this_03->ifFalse->type), bVar2)) {
              pLVar8 = Builder::makeLocalSet(&local_38,local_174,this_03->ifFalse);
              this_03->ifFalse = (Expression *)pLVar8;
            }
            local_188 = prelude_1;
            pEStack_170 = originalIfTrue;
            originalIfTrue =
                 (Expression *)Builder::makeLocalGet(&local_38,local_174,(Type)prelude_1);
          }
          pEVar14 = getPreludesWithExpression(this,pEVar14,this_03->ifTrue);
          this_03->ifTrue = pEVar14;
          if (this_03->ifFalse != (Expression *)0x0) {
            pEVar14 = getPreludesWithExpression(this,(Expression *)type_1.id,this_03->ifFalse);
            this_03->ifFalse = pEVar14;
          }
          If::finalize(this_03);
          if (pEStack_170 != (Expression *)0x0) {
            Visitor<wasm::ReFinalizeNode,_void>::visit
                      ((Visitor<wasm::ReFinalizeNode,_void> *)((long)&loop + 7),pEStack_170);
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,
                       &stack0xfffffffffffffe90);
          }
          ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
          ::replaceCurrent(&(this->
                            super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                            ).
                            super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                           ,originalIfTrue);
        }
      }
      else {
        pMVar5 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
                 getModule((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            *)&(this->
                               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                               ).
                               super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                          );
        ArenaVector<wasm::Expression_*>::ArenaVector
                  ((ArenaVector<wasm::Expression_*> *)&__range4,&pMVar5->allocator);
        this_01 = &(newList.allocator)->threadId;
        IVar19 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            this_01);
        __end4.index = (size_t)IVar19.parent;
        IVar19 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            this_01);
        while( true ) {
          __end4.parent = (ArenaVector<wasm::Expression_*> *)IVar19.index;
          item = (Expression *)IVar19.parent;
          bVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator!=((Iterator *)&__end4.index,(Iterator *)&item);
          if (!bVar2) break;
          ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                    operator*((Iterator *)&__end4.index);
          iter.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
          ._M_cur = (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                     )*ppEVar6;
          local_b8._M_cur =
               (__node_type *)
               std::
               unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
               ::find(&this->preludes,(key_type *)&iter);
          itemPreludes = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         std::
                         unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                         ::end(&this->preludes);
          bVar2 = std::__detail::operator!=
                            (&local_b8,
                             (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                              *)&itemPreludes);
          if (bVar2) {
            ppVar12 = std::__detail::
                      _Node_iterator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false,_false>
                      ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false,_false>
                                    *)&local_b8);
            this_02 = &ppVar12->second;
            __end6 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin
                               (this_02);
            prelude = (Expression *)
                      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end
                                (this_02);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end6,(__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                               *)&prelude), bVar2) {
              ppEVar18 = __gnu_cxx::
                         __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                         ::operator*(&__end6);
              type.id = (uintptr_t)*ppEVar18;
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         &__range4,(Expression *)type.id);
              __gnu_cxx::
              __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
              ::operator++(&__end6);
            }
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::clear(this_02);
          }
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     &__range4,
                     (Expression *)
                     iter.
                     super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                     ._M_cur);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                    ((Iterator *)&__end4.index);
          IVar19.index = (size_t)__end4.parent;
          IVar19.parent = (ArenaVector<wasm::Expression_*> *)item;
        }
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::swap
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                   &(newList.allocator)->threadId,(ArenaVector<wasm::Expression_*> *)&__range4);
        TStack_f0.id = (uintptr_t)
                       ((newList.allocator)->chunks).
                       super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
        bVar2 = wasm::Type::isConcrete(&stack0xffffffffffffff10);
        if (bVar2) {
          local_100._M_cur =
               (__node_type *)
               std::
               unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
               ::find(&this->breakTemps,
                      (key_type *)
                      &((newList.allocator)->chunks).
                       super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
          local_108._M_cur =
               (__node_type *)
               std::
               unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
               ::end(&this->breakTemps);
          bVar2 = std::__detail::operator!=(&local_100,&local_108);
          if (bVar2) {
            ppVar7 = std::__detail::
                     _Node_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>::
                     operator->((_Node_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>
                                 *)&local_100);
            iter_1.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur
            ._4_4_ = ppVar7->second;
          }
          else {
            pFVar15 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
                      getFunction((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   *)&(this->
                                      super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                      ).
                                      super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 );
            last = (Expression **)TStack_f0.id;
            iter_1.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur
            ._4_4_ = Builder::addVar(pFVar15,TStack_f0);
          }
          local_118 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  *)&(newList.allocator)->threadId);
          bVar2 = wasm::Type::isConcrete(&(*local_118)->type);
          if (bVar2) {
            pLVar8 = Builder::makeLocalSet
                               (&local_38,
                                iter_1.
                                super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>
                                ._M_cur._4_4_,*local_118);
            *local_118 = (Expression *)pLVar8;
          }
          pMVar1 = newList.allocator;
          wasm::Type::Type((Type *)&rep,none);
          Block::finalize((Block *)pMVar1,(Type)rep);
          local_130 = TStack_f0.id;
          local_128 = Builder::makeLocalGet
                                (&local_38,
                                 iter_1.
                                 super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>
                                 ._M_cur._4_4_,TStack_f0);
          ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
          ::replaceCurrent(&(this->
                            super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                            ).
                            super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                           ,(Expression *)local_128);
          local_138 = newList.allocator;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,
                     (value_type *)&local_138);
        }
        pMVar1 = newList.allocator;
        wasm::Type::Type((Type *)&iff,none);
        Block::finalize((Block *)pMVar1,(Type)iff);
      }
    }
    else {
      local_270._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
           ::find(&this->preludes,
                  (key_type *)
                  &ourPreludes.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
      set = (LocalSet *)
            std::
            unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
            ::end(&this->preludes);
      bVar2 = std::__detail::operator!=
                        (&local_270,
                         (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                          *)&set);
      if (bVar2) {
        ppVar12 = std::__detail::
                  _Node_iterator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false,_false>
                  ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false,_false>
                                *)&local_270);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::swap
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,
                   &ppVar12->second);
      }
      local_280 = Expression::dynCast<wasm::LocalSet>
                            ((Expression *)
                             ourPreludes.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (local_280 == (LocalSet *)0x0) {
        this_06 = Expression::dynCast<wasm::Break>
                            ((Expression *)
                             ourPreludes.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (this_06 == (Break *)0x0) {
          type_5.id = (uintptr_t)
                      Expression::dynCast<wasm::Switch>
                                ((Expression *)
                                 ourPreludes.
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (((Switch *)type_5.id != (Switch *)0x0) &&
             (((Switch *)type_5.id)->value != (Expression *)0x0)) {
            TStack_330.id = (((Switch *)type_5.id)->value->type).id;
            bVar2 = wasm::Type::isConcrete(&stack0xfffffffffffffcd0);
            if (bVar2) {
              pFVar15 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                        ::getFunction((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                       *)&(this->
                                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                          ).
                                          super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     );
              IVar3 = Builder::addVar(pFVar15,TStack_330);
              names._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   (size_t)Builder::makeLocalSet(&local_38,IVar3,*(Expression **)(type_5.id + 0x40))
              ;
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder
                         ,(value_type *)&names._M_t._M_impl.super__Rb_tree_header._M_node_count);
              BranchUtils::getUniqueTargets((NameSet *)&__range8,(Expression *)type_5.id);
              __end8 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::
                       begin((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                             &__range8);
              local_390._M_node =
                   (_Base_ptr)
                   std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                             ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *
                              )&__range8);
              while (bVar2 = std::operator!=(&__end8,&local_390), bVar2) {
                pNVar13 = std::_Rb_tree_const_iterator<wasm::Name>::operator*(&__end8);
                local_3c8 = (pNVar13->super_IString).str._M_len;
                pcStack_3c0 = (pNVar13->super_IString).str._M_str;
                local_3d0 = TStack_330.id;
                sStack_3a8 = local_3c8;
                name.super_IString.str._M_len = (size_t)pcStack_3c0;
                index = getTempForBreakTarget(this,(Name)(pNVar13->super_IString).str,TStack_330);
                local_3d8 = TStack_330.id;
                pLVar16 = Builder::makeLocalGet(&local_38,IVar3,TStack_330);
                local_3b0 = Builder::makeLocalSet(&local_38,index,(Expression *)pLVar16);
                std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           &builder,(value_type *)&local_3b0);
                std::_Rb_tree_const_iterator<wasm::Name>::operator++(&__end8);
              }
              *(undefined8 *)(type_5.id + 0x40) = 0;
              Switch::finalize((Switch *)type_5.id);
              std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
                        ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                         &__range8);
            }
            else {
              local_3dc = unreachable;
              bVar2 = wasm::Type::operator==(&stack0xfffffffffffffcd0,&local_3dc);
              if (!bVar2) {
                __assert_fail("type == Type::unreachable",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                              ,0x146,"void wasm::Flatten::visitExpression(Expression *)");
              }
              ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
              ::replaceCurrent(&(this->
                                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                ).
                                super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               ,*(Expression **)(type_5.id + 0x40));
            }
          }
        }
        else if (this_06->value != (Expression *)0x0) {
          blockType.id = (this_06->value->type).id;
          bVar2 = wasm::Type::isConcrete(&blockType);
          if (bVar2) {
            sStack_2c8 = (this_06->name).super_IString.str._M_len;
            pcStack_2c0 = (this_06->name).super_IString.str._M_str;
            pEVar14 = ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                      ::findBreakTarget(&(this->
                                         super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                         ).
                                         super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                        ,(Name)(this_06->name).super_IString.str);
            local_2f0 = (pEVar14->type).id;
            local_2e8 = (this_06->name).super_IString.str._M_len;
            pcStack_2e0 = (this_06->name).super_IString.str._M_str;
            local_2b8.id = local_2f0;
            local_2cc = getTempForBreakTarget
                                  (this,(Name)(this_06->name).super_IString.str,(Type)local_2f0);
            local_2f8 = Builder::makeLocalSet(&local_38,local_2cc,this_06->value);
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,
                       (value_type *)&local_2f8);
            bVar2 = wasm::Type::operator!=(&blockType,&local_2b8);
            if (bVar2) {
              pFVar15 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                        ::getFunction((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                       *)&(this->
                                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                          ).
                                          super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     );
              local_300 = blockType.id;
              IVar3 = Builder::addVar(pFVar15,blockType);
              pEVar14 = this_06->value;
              local_2cc = IVar3;
              pMVar5 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
                       getModule((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                  *)&(this->
                                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                     ).
                                     super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                );
              iVar4 = ExpressionManipulator::copy((EVP_PKEY_CTX *)pEVar14,(EVP_PKEY_CTX *)pMVar5);
              local_308 = Builder::makeLocalSet
                                    (&local_38,IVar3,(Expression *)CONCAT44(extraout_var,iVar4));
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder
                         ,(value_type *)&local_308);
            }
            if (this_06->condition != (Expression *)0x0) {
              local_310 = this_06;
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder
                         ,(value_type *)&local_310);
              bVar2 = wasm::Type::isConcrete
                                (&(this_06->super_SpecificExpression<(wasm::Expression::Id)4>).
                                  super_Expression.type);
              if (bVar2) {
                local_318 = blockType.id;
                pLVar16 = Builder::makeLocalGet(&local_38,local_2cc,blockType);
                ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                ::replaceCurrent(&(this->
                                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                  ).
                                  super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 ,(Expression *)pLVar16);
              }
              else {
                sw._4_4_ = 1;
                bVar2 = wasm::Type::operator==
                                  (&(this_06->super_SpecificExpression<(wasm::Expression::Id)4>).
                                    super_Expression.type,(BasicType *)((long)&sw + 4));
                if (!bVar2) {
                  __assert_fail("br->type == Type::unreachable",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                                ,0x128,"void wasm::Flatten::visitExpression(Expression *)");
                }
                pEVar14 = (Expression *)Builder::makeUnreachable(&local_38);
                ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                ::replaceCurrent(&(this->
                                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                  ).
                                  super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 ,pEVar14);
              }
            }
            this_06->value = (Expression *)0x0;
            Break::finalize(this_06);
          }
          else {
            sw._0_4_ = 1;
            bVar2 = wasm::Type::operator==(&blockType,(BasicType *)&sw);
            if (!bVar2) {
              __assert_fail("type == Type::unreachable",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                            ,0x12f,"void wasm::Flatten::visitExpression(Expression *)");
            }
            ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
            ::replaceCurrent(&(this->
                              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                              ).
                              super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             ,this_06->value);
          }
        }
      }
      else {
        bVar2 = LocalSet::isTee(local_280);
        if (bVar2) {
          local_284 = unreachable;
          bVar2 = wasm::Type::operator==(&local_280->value->type,&local_284);
          if (bVar2) {
            ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
            ::replaceCurrent(&(this->
                              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                              ).
                              super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             ,local_280->value);
          }
          else {
            LocalSet::makeSet(local_280);
            localType.id = (uintptr_t)local_280;
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,
                       (value_type *)&localType);
            pFVar15 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
                      getFunction((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   *)&(this->
                                      super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                      ).
                                      super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 );
            type_00 = Function::getLocalType(pFVar15,local_280->index);
            pLVar16 = Builder::makeLocalGet(&local_38,local_280->index,type_00);
            ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
            ::replaceCurrent(&(this->
                              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                              ).
                              super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             ,(Expression *)pLVar16);
          }
        }
      }
    }
    ourPreludes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
                  getCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                              *)&(this->
                                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                 ).
                                 super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            );
    Visitor<wasm::ReFinalizeNode,_void>::visit
              (&local_3dd,
               (Expression *)
               ourPreludes.
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    type_6.id._4_4_ = 1;
    bVar2 = wasm::Type::operator==
                      ((Type *)(ourPreludes.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1),
                       (BasicType *)((long)&type_6.id + 4));
    if (bVar2) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,
                 (value_type *)
                 &ourPreludes.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      pEVar14 = (Expression *)Builder::makeUnreachable(&local_38);
      ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
      replaceCurrent(&(this->
                      super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                      ).
                      super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                     ,pEVar14);
    }
    else {
      bVar2 = wasm::Type::isConcrete
                        ((Type *)(ourPreludes.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
      if (bVar2) {
        TStack_3f0.id =
             (uintptr_t)
             ourPreludes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage[1];
        pFVar15 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
                  getFunction((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               *)&(this->
                                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                  ).
                                  super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             );
        local_400 = TStack_3f0.id;
        local_3f4 = Builder::addVar(pFVar15,TStack_3f0);
        local_408 = Builder::makeLocalSet
                              (&local_38,local_3f4,
                               (Expression *)
                               ourPreludes.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,
                   (value_type *)&local_408);
        parent = (Expression *)TStack_3f0.id;
        pLVar16 = Builder::makeLocalGet(&local_38,local_3f4,TStack_3f0);
        ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
        replaceCurrent(&(this->
                        super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                        ).
                        super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                       ,(Expression *)pLVar16);
      }
    }
    bVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
    if (!bVar2) {
      parentPreludes =
           (mapped_type *)
           ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
           ::getParent(&(this->
                        super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                        ).
                        super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                      );
      if (((Expression *)parentPreludes == (Expression *)0x0) ||
         (bVar2 = Properties::isControlFlowStructure((Expression *)parentPreludes), bVar2)) {
        local_448 = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
                    getCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                *)&(this->
                                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                   ).
                                   super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                              );
        pmVar17 = std::
                  unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                  ::operator[](&this->preludes,&local_448);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::swap
                  (pmVar17,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           &builder);
      }
      else {
        pmVar17 = std::
                  unordered_map<wasm::Expression_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                  ::operator[](&this->preludes,(key_type *)&parentPreludes);
        __end4_1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin
                             ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                              &builder);
        prelude_2 = (Expression *)
                    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end
                              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &builder);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                   *)&prelude_2), bVar2) {
          ppEVar18 = __gnu_cxx::
                     __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                     ::operator*(&__end4_1);
          local_440 = *ppEVar18;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    (pmVar17,&local_440);
          __gnu_cxx::
          __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          ::operator++(&__end4_1);
        }
      }
    }
    local_48 = 0;
  }
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    std::vector<Expression*> ourPreludes;
    Builder builder(*getModule());

    // Nothing to do for constants and nop.
    if (Properties::isConstantExpression(curr) || curr->is<Nop>()) {
      return;
    }

    if (Properties::isControlFlowStructure(curr)) {
      // handle control flow explicitly. our children do not have control flow,
      // but they do have preludes which we need to set up in the right place

      // no one should have given us preludes, they are on the children
      assert(preludes.find(curr) == preludes.end());

      if (auto* block = curr->dynCast<Block>()) {
        // make a new list, where each item's preludes are added before it
        ExpressionList newList(getModule()->allocator);
        for (auto* item : block->list) {
          auto iter = preludes.find(item);
          if (iter != preludes.end()) {
            auto& itemPreludes = iter->second;
            for (auto* prelude : itemPreludes) {
              newList.push_back(prelude);
            }
            itemPreludes.clear();
          }
          newList.push_back(item);
        }
        block->list.swap(newList);
        // remove a block return value
        auto type = block->type;
        if (type.isConcrete()) {
          // if there is a temp index for breaking to the block, use that
          Index temp;
          auto iter = breakTemps.find(block->name);
          if (iter != breakTemps.end()) {
            temp = iter->second;
          } else {
            temp = builder.addVar(getFunction(), type);
          }
          auto*& last = block->list.back();
          if (last->type.isConcrete()) {
            last = builder.makeLocalSet(temp, last);
          }
          block->finalize(Type::none);
          // and we leave just a get of the value
          auto* rep = builder.makeLocalGet(temp, type);
          replaceCurrent(rep);
          // the whole block is now a prelude
          ourPreludes.push_back(block);
        }
        // the block now has no return value, and may have become unreachable
        block->finalize(Type::none);

      } else if (auto* iff = curr->dynCast<If>()) {
        // condition preludes go before the entire if
        auto* rep = getPreludesWithExpression(iff->condition, iff);
        // arm preludes go in the arms. we must also remove an if value
        auto* originalIfTrue = iff->ifTrue;
        auto* originalIfFalse = iff->ifFalse;
        auto type = iff->type;
        Expression* prelude = nullptr;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          if (iff->ifTrue->type.isConcrete()) {
            iff->ifTrue = builder.makeLocalSet(temp, iff->ifTrue);
          }
          if (iff->ifFalse && iff->ifFalse->type.isConcrete()) {
            iff->ifFalse = builder.makeLocalSet(temp, iff->ifFalse);
          }
          // the whole if (+any preludes from the condition) is now a prelude
          prelude = rep;
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
        }
        iff->ifTrue = getPreludesWithExpression(originalIfTrue, iff->ifTrue);
        if (iff->ifFalse) {
          iff->ifFalse =
            getPreludesWithExpression(originalIfFalse, iff->ifFalse);
        }
        iff->finalize();
        if (prelude) {
          ReFinalizeNode().visit(prelude);
          ourPreludes.push_back(prelude);
        }
        replaceCurrent(rep);

      } else if (auto* loop = curr->dynCast<Loop>()) {
        // remove a loop value
        Expression* rep = loop;
        auto* originalBody = loop->body;
        auto type = loop->type;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          loop->body = builder.makeLocalSet(temp, loop->body);
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
          // the whole if is now a prelude
          ourPreludes.push_back(loop);
          loop->type = Type::none;
        }
        loop->body = getPreludesWithExpression(originalBody, loop->body);
        loop->finalize();
        replaceCurrent(rep);

      } else if (auto* tryy = curr->dynCast<Try>()) {
        // remove a try value
        Expression* rep = tryy;
        auto* originalBody = tryy->body;
        std::vector<Expression*> originalCatchBodies(tryy->catchBodies.begin(),
                                                     tryy->catchBodies.end());
        auto type = tryy->type;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          if (tryy->body->type.isConcrete()) {
            tryy->body = builder.makeLocalSet(temp, tryy->body);
          }
          for (Index i = 0; i < tryy->catchBodies.size(); i++) {
            if (tryy->catchBodies[i]->type.isConcrete()) {
              tryy->catchBodies[i] =
                builder.makeLocalSet(temp, tryy->catchBodies[i]);
            }
          }
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
          // the whole try is now a prelude
          ourPreludes.push_back(tryy);
        }
        tryy->body = getPreludesWithExpression(originalBody, tryy->body);
        for (Index i = 0; i < tryy->catchBodies.size(); i++) {
          tryy->catchBodies[i] = getPreludesWithExpression(
            originalCatchBodies[i], tryy->catchBodies[i]);
        }
        tryy->finalize();
        replaceCurrent(rep);

      } else {
        WASM_UNREACHABLE("unexpected expr type");
      }

    } else {
      // for anything else, there may be existing preludes
      auto iter = preludes.find(curr);
      if (iter != preludes.end()) {
        ourPreludes.swap(iter->second);
      }

      // special handling
      if (auto* set = curr->dynCast<LocalSet>()) {
        if (set->isTee()) {
          // we disallow local.tee
          if (set->value->type == Type::unreachable) {
            replaceCurrent(set->value); // trivial, no set happens
          } else {
            // use a set in a prelude + a get
            set->makeSet();
            ourPreludes.push_back(set);
            Type localType = getFunction()->getLocalType(set->index);
            replaceCurrent(builder.makeLocalGet(set->index, localType));
          }
        }

      } else if (auto* br = curr->dynCast<Break>()) {
        if (br->value) {
          auto type = br->value->type;
          if (type.isConcrete()) {
            // we are sending a value. use a local instead
            Type blockType = findBreakTarget(br->name)->type;
            Index temp = getTempForBreakTarget(br->name, blockType);
            ourPreludes.push_back(builder.makeLocalSet(temp, br->value));

            // br_if leaves a value on the stack if not taken, which later can
            // be the last element of the enclosing innermost block and flow
            // out. The local we created using 'getTempForBreakTarget' returns
            // the return type of the block this branch is targetting, which may
            // not be the same with the innermost block's return type. For
            // example,
            // (block $any (result anyref)
            //   (block (result funcref)
            //     (local.tee $0
            //       (br_if $any
            //         (ref.null func)
            //         (i32.const 0)
            //       )
            //     )
            //   )
            // )
            // In this case we need two locals to store (ref.null); one with
            // funcref type that's for the target block ($label0) and one more
            // with anyref type in case for flowing out. Here we create the
            // second 'flowing out' local in case two block's types are
            // different.
            if (type != blockType) {
              temp = builder.addVar(getFunction(), type);
              ourPreludes.push_back(builder.makeLocalSet(
                temp, ExpressionManipulator::copy(br->value, *getModule())));
            }

            if (br->condition) {
              // the value must also flow out
              ourPreludes.push_back(br);
              if (br->type.isConcrete()) {
                replaceCurrent(builder.makeLocalGet(temp, type));
              } else {
                assert(br->type == Type::unreachable);
                replaceCurrent(builder.makeUnreachable());
              }
            }
            br->value = nullptr;
            br->finalize();
          } else {
            assert(type == Type::unreachable);
            // we don't need the br at all
            replaceCurrent(br->value);
          }
        }

      } else if (auto* sw = curr->dynCast<Switch>()) {
        if (sw->value) {
          auto type = sw->value->type;
          if (type.isConcrete()) {
            // we are sending a value. use a local instead
            Index temp = builder.addVar(getFunction(), type);
            ourPreludes.push_back(builder.makeLocalSet(temp, sw->value));
            // we don't know which break target will be hit - assign to them all
            auto names = BranchUtils::getUniqueTargets(sw);
            for (auto name : names) {
              ourPreludes.push_back(
                builder.makeLocalSet(getTempForBreakTarget(name, type),
                                     builder.makeLocalGet(temp, type)));
            }
            sw->value = nullptr;
            sw->finalize();
          } else {
            assert(type == Type::unreachable);
            // we don't need the br at all
            replaceCurrent(sw->value);
          }
        }
      }
    }

    // continue for general handling of everything, control flow or otherwise
    curr = getCurrent(); // we may have replaced it
    // we have changed children
    ReFinalizeNode().visit(curr);
    if (curr->type == Type::unreachable) {
      ourPreludes.push_back(curr);
      replaceCurrent(builder.makeUnreachable());
    } else if (curr->type.isConcrete()) {
      // use a local
      auto type = curr->type;
      Index temp = builder.addVar(getFunction(), type);
      ourPreludes.push_back(builder.makeLocalSet(temp, curr));
      replaceCurrent(builder.makeLocalGet(temp, type));
    }

    // next, finish up: migrate our preludes if we can
    if (!ourPreludes.empty()) {
      auto* parent = getParent();
      if (parent && !Properties::isControlFlowStructure(parent)) {
        auto& parentPreludes = preludes[parent];
        for (auto* prelude : ourPreludes) {
          parentPreludes.push_back(prelude);
        }
      } else {
        // keep our preludes, parent will handle them
        preludes[getCurrent()].swap(ourPreludes);
      }
    }
  }